

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_ostream.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pVVar1;
  Option *pOVar2;
  ulong uVar3;
  long lVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>
  __l;
  Level level;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  map;
  App app;
  Level local_598;
  int local_594;
  undefined1 *local_590;
  long local_588;
  undefined1 local_580 [16];
  _Any_data local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  undefined1 local_550 [16];
  code *local_540;
  _Invoker_type p_Stack_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  undefined8 local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  int local_510;
  undefined2 local_50c;
  undefined4 local_500;
  string local_4f8;
  string local_4d8;
  _Any_data local_4b8;
  code *local_4a8;
  undefined8 local_4a0;
  _Any_data local_498;
  code *local_488;
  _Invoker_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  undefined8 local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  int local_458;
  undefined2 local_454;
  string local_450;
  string local_430;
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  local_3f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  local_3c0;
  App local_390;
  
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
  CLI::App::App(&local_390,&local_430,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_598 = Low;
  local_570._M_unused._M_object = &local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"high","");
  local_550._0_4_ = 0;
  local_550._8_8_ = &p_Stack_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_550 + 8),"medium","");
  local_528 = CONCAT44(local_528._4_4_,1);
  local_520._M_allocated_capacity = (size_type)&local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"low","");
  local_500 = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_570;
  local_594 = argc;
  CLI::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
         *)&local_3c0,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_410,(allocator_type *)&local_590);
  lVar4 = 0;
  do {
    if ((void *)((long)&local_510 + lVar4) != *(void **)((long)&local_520 + lVar4)) {
      operator_delete(*(void **)((long)&local_520 + lVar4));
    }
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x78);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"-l,--level","");
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"Level settings","");
  pOVar2 = CLI::App::add_option<Level,_Level,_(CLI::detail::enabler)0>
                     (&local_390,&local_4d8,&local_598,&local_4f8);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::_Rb_tree(&local_3f0,&local_3c0);
  CLI::CheckedTransformer::
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>
            ((CheckedTransformer *)&local_570,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
              *)&local_3f0,CLI::ignore_case);
  local_4b8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_4b8._8_8_ = 0;
  local_4a8 = (code *)0x0;
  local_4a0 = local_560._8_8_;
  if ((code *)local_560._M_allocated_capacity != (code *)0x0) {
    local_4b8._M_unused._M_object = local_570._M_unused._M_object;
    local_4b8._8_8_ = local_570._8_8_;
    local_4a8 = (code *)local_560._M_allocated_capacity;
    local_560._M_allocated_capacity = 0;
    local_560._8_8_ = 0;
  }
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = (_Invoker_type *)0x0;
  local_488 = (code *)0x0;
  local_480 = p_Stack_538;
  if (local_540 != (code *)0x0) {
    local_498._M_unused._M_member_pointer = CONCAT44(local_550._4_4_,local_550._0_4_);
    local_498._8_8_ = local_550._8_8_;
    local_488 = local_540;
    local_540 = (code *)0x0;
    p_Stack_538 = (_Invoker_type)0x0;
  }
  local_478 = &local_468;
  if (local_530 == &local_520) {
    local_468._8_4_ = local_520._8_4_;
    local_468._12_4_ = local_520._12_4_;
  }
  else {
    local_478 = local_530;
  }
  local_468._M_allocated_capacity = local_520._M_allocated_capacity;
  local_470 = local_528;
  local_528 = 0;
  local_520._M_allocated_capacity = local_520._M_allocated_capacity & 0xffffffffffffff00;
  local_458 = local_510;
  local_454 = local_50c;
  local_590 = local_580;
  local_530 = &local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&pOVar2->validators_,
             (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_4b8);
  if (local_588 != 0) {
    pVVar1 = (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char*>((string *)local_410,local_590,local_590 + local_588);
    std::__cxx11::string::operator=((string *)&pVVar1->name_,(string *)local_410);
    if (local_410[0] != local_400) {
      operator_delete(local_410[0]);
    }
  }
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478);
  }
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,__destroy_functor);
  }
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530);
  }
  if (local_540 != (code *)0x0) {
    (*local_540)((_Any_data *)local_550,(_Any_data *)local_550,__destroy_functor);
  }
  if ((code *)local_560._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_560._M_allocated_capacity)(&local_570,&local_570,3);
  }
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~_Rb_tree(&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p);
  }
  CLI::App::parse_char_t<char>(&local_390,local_594,argv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enum received: ",0xf);
  uVar3 = (ulong)local_598;
  if (uVar3 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(&PTR_anon_var_dwarf_459a0_00140d60)[uVar3],
               *(long *)(&DAT_00132fc8 + uVar3 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," (ft rom custom ostream)",0x18);
  local_570._M_pod_data[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_570._M_pod_data,1);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::~_Rb_tree(&local_3c0);
  CLI::App::~App(&local_390);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;

    Level level{Level::Low};
    // specify string->value mappings
    std::map<std::string, Level> map{{"high", Level::High}, {"medium", Level::Medium}, {"low", Level::Low}};
    // CheckedTransformer translates and checks whether the results are either in one of the strings or in one of the
    // translations already
    app.add_option("-l,--level", level, "Level settings")
        ->required()
        ->transform(CLI::CheckedTransformer(map, CLI::ignore_case));

    CLI11_PARSE(app, argc, argv);

    // CLI11's built in enum streaming can be used outside CLI11 like this:
    using CLI::enums::operator<<;
    std::cout << "Enum received: " << level << '\n';

    return 0;
}